

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O0

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::Gen1Viol(SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ViolSummary *vs,MemoryWriter *wrt,bool f_max,string *type)

{
  byte in_CL;
  int *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string vmaxrel;
  string vmaxabs;
  char *in_stack_000001b0;
  double in_stack_000001b8;
  bool in_stack_000001c7;
  SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_000001c8;
  BasicCStringRef<char> in_stack_ffffffffffffff68;
  BasicCStringRef<char> in_stack_ffffffffffffff70;
  BasicCStringRef<char> local_88 [3];
  string local_70 [32];
  string local_50 [32];
  BasicCStringRef<char> local_30 [2];
  byte local_19;
  
  local_19 = in_CL & 1;
  if (*in_RSI != 0) {
    fmt::BasicCStringRef<char>::BasicCStringRef(local_30,"  {:27}");
    fmt::BasicWriter<char>::write<std::__cxx11::string>
              ((BasicWriter<char> *)in_stack_ffffffffffffff68.data_,in_stack_ffffffffffffff70,in_RDI
              );
    SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::Gen1ViolMax_abi_cxx11_
              (in_stack_000001c8,in_stack_000001c7,in_stack_000001b8,in_stack_000001b0);
    SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::Gen1ViolMax_abi_cxx11_
              (in_stack_000001c8,in_stack_000001c7,in_stack_000001b8,in_stack_000001b0);
    fmt::BasicCStringRef<char>::BasicCStringRef(local_88,"  {:14}");
    fmt::BasicWriter<char>::write<std::__cxx11::string>
              ((BasicWriter<char> *)in_stack_ffffffffffffff68.data_,in_stack_ffffffffffffff70,in_RDI
              );
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffff70,"  {:14}");
    fmt::BasicWriter<char>::write<std::__cxx11::string>
              ((BasicWriter<char> *)in_stack_ffffffffffffff68.data_,in_stack_ffffffffffffff70,in_RDI
              );
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffff68,"\n");
    fmt::BasicWriter<char>::write<>
              ((BasicWriter<char> *)in_stack_ffffffffffffff68.data_,in_stack_ffffffffffffff70);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void Gen1Viol(
      const ViolSummary& vs, fmt::MemoryWriter& wrt,
      bool f_max, const std::string& type) {
    if (vs.N_) {
      // wrt.write("  {:16} {:<7}", type, vs.N_);
      wrt.write("  {:27}", type);
      auto vmaxabs = Gen1ViolMax(  // true: 1 for logical
            f_max, vs.epsAbsMax_, vs.nameAbs_);
      auto vmaxrel = Gen1ViolMax(
            f_max, vs.epsRelMax_, vs.nameRel_);
      wrt.write("  {:14}", vmaxabs);
      wrt.write("  {:14}", vmaxrel);
      wrt.write("\n");
    }
  }